

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlrelationaltablemodel.cpp
# Opt level: O2

QSqlTableModel * __thiscall
QSqlRelationalTableModel::relationModel(QSqlRelationalTableModel *this,int column)

{
  long lVar1;
  QRelation *this_00;
  Data *dd;
  bool bVar2;
  long lVar3;
  QRelatedTableModel *pQVar4;
  
  if (-1 < column) {
    if ((ulong)(uint)column < *(ulong *)(*(long *)(this + 8) + 0x2f8)) {
      lVar1 = *(long *)(*(long *)(this + 8) + 0x2f0);
      lVar3 = (ulong)(uint)column * 0x10;
      this_00 = *(QRelation **)(lVar1 + lVar3);
      dd = *(Data **)(lVar1 + 8 + lVar3);
      if (dd != (Data *)0x0) {
        LOCK();
        (dd->weakref)._q_value.super___atomic_base<int>._M_i =
             (dd->weakref)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        LOCK();
        (dd->strongref)._q_value.super___atomic_base<int>._M_i =
             (dd->strongref)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      if ((this_00 == (QRelation *)0x0) || (bVar2 = QRelation::isValid(this_00), !bVar2)) {
        pQVar4 = (QRelatedTableModel *)0x0;
      }
      else {
        pQVar4 = this_00->model;
        if (pQVar4 == (QRelatedTableModel *)0x0) {
          QRelation::populateModel(this_00);
          pQVar4 = this_00->model;
        }
      }
      QSharedPointer<QRelation>::deref(dd);
      return &pQVar4->super_QSqlTableModel;
    }
  }
  return (QSqlTableModel *)0x0;
}

Assistant:

QSqlTableModel *QSqlRelationalTableModel::relationModel(int column) const
{
    Q_D(const QSqlRelationalTableModel);
    if (column < 0 || column >= d->relations.size())
        return nullptr;

    auto relation = d->relations.at(column);
    if (!relation || !relation->isValid())
        return nullptr;

    if (!relation->model)
        relation->populateModel();
    return relation->model;
}